

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
* __thiscall
diff_match_patch_test::diff_rebuildtexts_abi_cxx11_
          (deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *__return_storage_ptr__,diff_match_patch_test *this,
          deque<Diff,_std::allocator<Diff>_> *diffs)

{
  bool bVar1;
  reference pDVar2;
  reference pvVar3;
  Diff *myDiff;
  iterator __end1;
  iterator __begin1;
  deque<Diff,_std::allocator<Diff>_> *__range1;
  deque<Diff,_std::allocator<Diff>_> *diffs_local;
  diff_match_patch_test *this_local;
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *text;
  
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::deque(__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  std::
  deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::emplace_back<>(__return_storage_ptr__);
  std::deque<Diff,_std::allocator<Diff>_>::begin((iterator *)&__end1._M_node,diffs);
  std::deque<Diff,_std::allocator<Diff>_>::end((iterator *)&myDiff,diffs);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&myDiff), bVar1) {
    pDVar2 = std::_Deque_iterator<Diff,_Diff_&,_Diff_*>::operator*
                       ((_Deque_iterator<Diff,_Diff_&,_Diff_*> *)&__end1._M_node);
    if (pDVar2->operation != Insert) {
      pvVar3 = std::
               deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      std::__cxx11::wstring::operator+=((wstring *)pvVar3,(wstring *)&pDVar2->text);
    }
    if (pDVar2->operation != Delete) {
      pvVar3 = std::
               deque<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ::operator[](__return_storage_ptr__,1);
      std::__cxx11::wstring::operator+=((wstring *)pvVar3,(wstring *)&pDVar2->text);
    }
    std::_Deque_iterator<Diff,_Diff_&,_Diff_*>::operator++
              ((_Deque_iterator<Diff,_Diff_&,_Diff_*> *)&__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<std::wstring> diff_match_patch_test::diff_rebuildtexts(std::deque<Diff> diffs) {
  std::deque<std::wstring> text;
  text.emplace_back();
  text.emplace_back();
  for (const Diff& myDiff : diffs) {
    if (myDiff.operation != Diff::Operation::Insert) {
      text[0] += myDiff.text;
    }
    if (myDiff.operation != Diff::Operation::Delete) {
      text[1] += myDiff.text;
    }
  }
  return text;
}